

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O1

void __thiscall
FIX::DataDictionary::addXMLGroup
          (DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode,string *msgtype,DataDictionary *DD,
          bool groupRequired)

{
  _func_int **pp_Var1;
  DOMNode *pDVar2;
  long *plVar3;
  DOMNode *pDVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int field;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *p_Var8;
  ConfigError *this_00;
  DOMDocument *pDVar9;
  undefined7 in_register_00000089;
  bool groupRequired_00;
  DOMNodePtr node;
  DOMAttributesPtr attrs_1;
  string required;
  string name;
  DOMAttributesPtr attrs;
  DataDictionary groupDD;
  DOMNode *local_4b0;
  long *local_4a8;
  long *local_4a0 [2];
  long local_490 [2];
  DOMNode *local_480;
  undefined8 local_478;
  DOMNode local_470 [2];
  string *local_460;
  DataDictionary *local_458;
  undefined4 local_450;
  int local_44c;
  string local_448;
  DOMDocument *local_428;
  long *local_420;
  DataDictionary *local_418;
  undefined1 local_410 [152];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_378 [17];
  
  local_450 = (undefined4)CONCAT71(in_register_00000089,groupRequired);
  local_460 = msgtype;
  local_458 = this;
  local_428 = pDoc;
  (*pNode->_vptr_DOMNode[4])(&local_420,pNode);
  plVar3 = local_420;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = '\0';
  pp_Var1 = (_func_int **)(local_410 + 0x10);
  local_410._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"name","");
  pDVar9 = (DOMDocument *)local_410;
  cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,pDVar9,&local_448);
  if ((_func_int **)local_410._0_8_ != pp_Var1) {
    pDVar9 = (DOMDocument *)(local_410._16_8_ + 1);
    operator_delete((void *)local_410._0_8_,(ulong)pDVar9);
  }
  if (cVar5 == '\0') {
    this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_410._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"No name given to group","")
    ;
    ConfigError::ConfigError(this_00,(string *)local_410);
    __cxa_throw(this_00,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  iVar6 = lookupXMLFieldNumber(local_458,pDVar9,&local_448);
  DataDictionary((DataDictionary *)local_410);
  (*pNode->_vptr_DOMNode[2])(&local_4b0,pNode);
  local_44c = iVar6;
  local_418 = DD;
  if (local_4b0 == (DOMNode *)0x0) {
    iVar6 = 0;
  }
  else {
    field = 0;
    iVar6 = 0;
    do {
      (*local_4b0->_vptr_DOMNode[5])(&local_480);
      pDVar9 = (DOMDocument *)0x1cc33a;
      iVar7 = std::__cxx11::string::compare((char *)&local_480);
      if (local_480 != local_470) {
        pDVar9 = (DOMDocument *)
                 (CONCAT71(local_470[0]._vptr_DOMNode._1_7_,local_470[0]._vptr_DOMNode._0_1_) + 1);
        operator_delete(local_480,(ulong)pDVar9);
      }
      if (iVar7 == 0) {
        field = lookupXMLFieldNumber(local_458,pDVar9,local_4b0);
        addField((DataDictionary *)local_410,field);
        (*local_4b0->_vptr_DOMNode[4])(&local_4a8);
        plVar3 = local_4a8;
        local_478 = 0;
        local_470[0]._vptr_DOMNode._0_1_ = 0;
        local_4a0[0] = local_490;
        local_480 = local_470;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"required","");
        cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,(string *)local_4a0,&local_480);
        if ((cVar5 == '\0') ||
           ((iVar7 = std::__cxx11::string::compare((char *)&local_480), iVar7 != 0 &&
            (iVar7 = std::__cxx11::string::compare((char *)&local_480), iVar7 != 0)))) {
          if (local_4a0[0] != local_490) {
            operator_delete(local_4a0[0],local_490[0] + 1);
          }
        }
        else {
          if (local_4a0[0] != local_490) {
            operator_delete(local_4a0[0],local_490[0] + 1);
          }
          if ((char)local_450 != '\0') {
            local_4a0[0] = (long *)CONCAT44(local_4a0[0]._4_4_,field);
            p_Var8 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                     ::operator[](local_378,local_460);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(p_Var8,(int *)local_4a0);
          }
        }
LAB_0015f327:
        if (local_480 != local_470) {
          operator_delete(local_480,
                          CONCAT71(local_470[0]._vptr_DOMNode._1_7_,local_470[0]._vptr_DOMNode._0_1_
                                  ) + 1);
        }
        if (local_4a8 != (long *)0x0) {
          (**(code **)(*local_4a8 + 8))();
        }
      }
      else {
        (*local_4b0->_vptr_DOMNode[5])(&local_480);
        iVar7 = std::__cxx11::string::compare((char *)&local_480);
        if (local_480 != local_470) {
          operator_delete(local_480,
                          CONCAT71(local_470[0]._vptr_DOMNode._1_7_,local_470[0]._vptr_DOMNode._0_1_
                                  ) + 1);
        }
        if (iVar7 == 0) {
          field = addXMLComponentFields
                            (local_458,local_428,local_4b0,local_460,(DataDictionary *)local_410,
                             false);
        }
        else {
          (*local_4b0->_vptr_DOMNode[5])(&local_480);
          pDVar9 = (DOMDocument *)0x1c7a01;
          iVar7 = std::__cxx11::string::compare((char *)&local_480);
          if (local_480 != local_470) {
            pDVar9 = (DOMDocument *)
                     (CONCAT71(local_470[0]._vptr_DOMNode._1_7_,local_470[0]._vptr_DOMNode._0_1_) +
                     1);
            operator_delete(local_480,(ulong)pDVar9);
          }
          if (iVar7 == 0) {
            field = lookupXMLFieldNumber(local_458,pDVar9,local_4b0);
            addField((DataDictionary *)local_410,field);
            (*local_4b0->_vptr_DOMNode[4])(&local_4a8);
            plVar3 = local_4a8;
            local_478 = 0;
            local_470[0]._vptr_DOMNode._0_1_ = 0;
            local_4a0[0] = local_490;
            local_480 = local_470;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"required","");
            cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,(string *)local_4a0,&local_480);
            if ((cVar5 == '\0') ||
               ((iVar7 = std::__cxx11::string::compare((char *)&local_480), iVar7 != 0 &&
                (iVar7 = std::__cxx11::string::compare((char *)&local_480), iVar7 != 0)))) {
              if (local_4a0[0] != local_490) {
                operator_delete(local_4a0[0],local_490[0] + 1);
              }
            }
            else {
              if (local_4a0[0] != local_490) {
                operator_delete(local_4a0[0],local_490[0] + 1);
              }
              if ((char)local_450 != '\0') {
                local_4a0[0] = (long *)CONCAT44(local_4a0[0]._4_4_,field);
                p_Var8 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                          ::operator[](local_378,local_460);
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>(p_Var8,(int *)local_4a0);
              }
            }
            plVar3 = local_4a8;
            local_4a0[0] = local_490;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"required","");
            cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,(string *)local_4a0,&local_480);
            if (local_4a0[0] != local_490) {
              operator_delete(local_4a0[0],local_490[0] + 1);
            }
            if (cVar5 == '\0') {
              groupRequired_00 = false;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_480);
              if (iVar7 == 0) {
                groupRequired_00 = true;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)&local_480);
                groupRequired_00 = iVar7 == 0;
              }
            }
            addXMLGroup(local_458,local_428,local_4b0,local_460,(DataDictionary *)local_410,
                        groupRequired_00);
            goto LAB_0015f327;
          }
        }
      }
      if (iVar6 == 0) {
        iVar6 = field;
      }
      (*local_4b0->_vptr_DOMNode[3])(&local_480);
      pDVar4 = local_480;
      pDVar2 = local_4b0;
      local_480 = (DOMNode *)0x0;
      local_4b0 = pDVar4;
      if (pDVar2 != (DOMNode *)0x0) {
        (*pDVar2->_vptr_DOMNode[1])();
      }
      if (local_480 != (DOMNode *)0x0) {
        (*local_480->_vptr_DOMNode[1])();
      }
    } while (local_4b0 != (DOMNode *)0x0);
  }
  if (iVar6 != 0) {
    addGroup(local_418,local_460,local_44c,iVar6,(DataDictionary *)local_410);
  }
  if (local_4b0 != (DOMNode *)0x0) {
    (*local_4b0->_vptr_DOMNode[1])();
  }
  ~DataDictionary((DataDictionary *)local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,
                    CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                             local_448.field_2._M_local_buf[0]) + 1);
  }
  if (local_420 != (long *)0x0) {
    (**(code **)(*local_420 + 8))();
  }
  return;
}

Assistant:

void DataDictionary::addXMLGroup(
    DOMDocument *pDoc,
    DOMNode *pNode,
    const std::string &msgtype,
    DataDictionary &DD,
    bool groupRequired) {
  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to group");
  }
  int group = lookupXMLFieldNumber(pDoc, name);
  int delim = 0;
  int field = 0;
  DataDictionary groupDD;
  DOMNodePtr node = pNode->getFirstChildNode();
  while (node.get()) {
    if (node->getName() == "field") {
      field = lookupXMLFieldNumber(pDoc, node.get());
      groupDD.addField(field);

      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && groupRequired) {
        groupDD.addRequiredField(msgtype, field);
      }
    } else if (node->getName() == "component") {
      field = addXMLComponentFields(pDoc, node.get(), msgtype, groupDD, false);
    } else if (node->getName() == "group") {
      field = lookupXMLFieldNumber(pDoc, node.get());
      groupDD.addField(field);
      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && groupRequired) {
        groupDD.addRequiredField(msgtype, field);
      }
      bool isRequired = false;
      if (attrs->get("required", required)) {
        isRequired = (required == "Y" || required == "y");
      }
      addXMLGroup(pDoc, node.get(), msgtype, groupDD, isRequired);
    }
    if (delim == 0) {
      delim = field;
    }
    RESET_AUTO_PTR(node, node->getNextSiblingNode());
  }

  if (delim) {
    DD.addGroup(msgtype, group, delim, groupDD);
  }
}